

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzautopointer.h
# Opt level: O0

TPZAutoPointer<TPZStructMatrix> * __thiscall
TPZAutoPointer<TPZStructMatrix>::operator=
          (TPZAutoPointer<TPZStructMatrix> *this,TPZStructMatrix *rval)

{
  bool bVar1;
  TPZStructMatrix *pTVar2;
  TPZReference *in_RDI;
  TPZAutoPointer<TPZStructMatrix> *in_stack_ffffffffffffffd0;
  TPZStructMatrix *in_stack_ffffffffffffffe0;
  TPZReference *in_stack_ffffffffffffffe8;
  
  if ((in_RDI->fPointer != (TPZStructMatrix *)0x0) &&
     (bVar1 = TPZReference::Decrease(in_RDI), bVar1)) {
    Release(in_stack_ffffffffffffffd0);
  }
  pTVar2 = (TPZStructMatrix *)operator_new(0x10);
  TPZReference::TPZReference(in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0);
  in_RDI->fPointer = pTVar2;
  return (TPZAutoPointer<TPZStructMatrix> *)in_RDI;
}

Assistant:

TPZAutoPointer &operator=(T *rval)
    {
        if (fRef && fRef->Decrease()){
            Release();
        }
        fRef = new TPZReference(rval);
        return *this;
    }